

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  stbi_uc *psVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  stbi__uint32 sVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  stbi_uc *psVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  byte bVar26;
  long lVar27;
  byte bVar28;
  long lVar29;
  ulong uVar30;
  stbi_uc *psVar31;
  uint uVar32;
  byte *pbVar33;
  uint uVar34;
  stbi_uc *psVar35;
  byte *pbVar36;
  bool bVar37;
  int local_d0;
  ulong local_68;
  ulong uVar18;
  
  bVar37 = depth == 0x10;
  uVar3 = x * out_n;
  uVar4 = uVar3 << bVar37;
  iVar2 = a->s->img_n;
  uVar5 = iVar2 << bVar37;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                  ,0x10c6,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  local_d0 = 0;
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar37,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    uVar6 = iVar2 * x;
    uVar17 = uVar6 * depth + 7 >> 3;
    uVar18 = (ulong)uVar17;
    if (raw_len < (uVar17 + 1) * y) {
      stbi__g_failure_reason = "not enough pixels";
    }
    else if (y == 0) {
LAB_0011be96:
      local_d0 = 1;
      if (depth == 0x10) {
LAB_0011bea8:
        if (uVar3 * y == 0) {
LAB_0011bed6:
          local_d0 = 1;
        }
        else {
          local_d0 = 1;
          psVar8 = a->out;
          lVar13 = 0;
          do {
            puVar1 = (ushort *)(psVar8 + lVar13 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar13 = lVar13 + 1;
          } while (uVar3 * y != (int)lVar13);
        }
      }
    }
    else {
      bVar26 = *raw;
      if (bVar26 < 5) {
        lVar13 = (long)iVar2;
        lVar14 = (long)(out_n << bVar37);
        iVar7 = x - 1;
        uVar9 = (ulong)y;
        psVar8 = a->out;
        lVar15 = -lVar14;
        lVar25 = -(ulong)uVar4;
        uVar21 = 0;
        local_68 = (ulong)x;
        lVar27 = 0;
        do {
          if (depth < 8) {
            if (x < uVar17) {
              __assert_fail("img_width_bytes <= x",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                            ,0x10da,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            psVar8 = psVar8 + (uVar3 - uVar17);
            uVar5 = 1;
            local_68 = uVar18;
          }
          if (lVar27 == 0) {
            bVar26 = ""[bVar26];
          }
          if (0 < (int)uVar5) {
            uVar30 = 0;
            do {
              switch(bVar26) {
              case 0:
              case 1:
              case 5:
              case 6:
                bVar10 = raw[uVar30 + 1];
                goto LAB_0011b4c3;
              case 2:
              case 4:
                bVar10 = psVar8[uVar30 + lVar25];
                break;
              case 3:
                bVar10 = psVar8[uVar30 + lVar25] >> 1;
                break;
              default:
                goto switchD_0011b4ab_default;
              }
              bVar10 = bVar10 + raw[uVar30 + 1];
LAB_0011b4c3:
              psVar8[uVar30] = bVar10;
switchD_0011b4ab_default:
              uVar30 = uVar30 + 1;
            } while (uVar5 != uVar30);
          }
          if (depth == 8) {
            lVar29 = (long)out_n;
            lVar16 = lVar13;
            if (iVar2 != out_n) {
              psVar8[lVar13] = 0xff;
            }
LAB_0011b52a:
            raw = raw + lVar16 + 1;
          }
          else {
            if (depth == 0x10) {
              lVar16 = (long)(int)uVar5;
              lVar29 = lVar14;
              if (iVar2 != out_n) {
                psVar8[lVar16] = 0xff;
                psVar8[lVar16 + 1] = 0xff;
              }
              goto LAB_0011b52a;
            }
            raw = raw + 2;
            lVar29 = 1;
          }
          psVar35 = psVar8 + lVar29;
          if (depth < 8 || iVar2 == out_n) {
            uVar11 = ((int)local_68 + -1) * uVar5;
            switch(bVar26) {
            case 0:
              memcpy(psVar35,raw,(long)(int)uVar11);
              break;
            case 1:
              if (0 < (int)uVar11) {
                uVar21 = 0;
                do {
                  psVar35[uVar21] = psVar8[uVar21 + (lVar29 - (int)uVar5)] + raw[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar11 != uVar21);
              }
              break;
            case 2:
              if (0 < (int)uVar11) {
                uVar21 = 0;
                do {
                  psVar35[uVar21] = psVar35[uVar21 + lVar25] + raw[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar11 != uVar21);
              }
              break;
            case 3:
              if (0 < (int)uVar11) {
                uVar21 = 0;
                do {
                  psVar35[uVar21] =
                       (char)((uint)psVar8[uVar21 + (lVar29 - (int)uVar5)] +
                              (uint)psVar35[uVar21 + lVar25] >> 1) + raw[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar11 != uVar21);
              }
              break;
            case 4:
              if (0 < (int)uVar11) {
                pbVar36 = psVar8 + (lVar29 - (int)uVar5);
                uVar21 = 0;
                do {
                  bVar26 = *pbVar36;
                  bVar10 = psVar35[lVar25];
                  bVar28 = pbVar36[lVar25];
                  iVar22 = ((uint)bVar10 + (uint)bVar26) - (uint)bVar28;
                  uVar32 = iVar22 - (uint)bVar26;
                  uVar34 = -uVar32;
                  if (0 < (int)uVar32) {
                    uVar34 = uVar32;
                  }
                  uVar20 = iVar22 - (uint)bVar10;
                  uVar32 = -uVar20;
                  if (0 < (int)uVar20) {
                    uVar32 = uVar20;
                  }
                  uVar23 = iVar22 - (uint)bVar28;
                  uVar20 = -uVar23;
                  if (0 < (int)uVar23) {
                    uVar20 = uVar23;
                  }
                  if (uVar32 <= uVar20) {
                    bVar28 = bVar10;
                  }
                  if (uVar20 < uVar34) {
                    bVar26 = bVar28;
                  }
                  if (uVar32 < uVar34) {
                    bVar26 = bVar28;
                  }
                  *psVar35 = bVar26 + raw[uVar21];
                  uVar21 = uVar21 + 1;
                  pbVar36 = pbVar36 + 1;
                  psVar35 = psVar35 + 1;
                } while (uVar11 != uVar21);
              }
              break;
            case 5:
              if (0 < (int)uVar11) {
                uVar21 = 0;
                do {
                  psVar35[uVar21] = (psVar8[uVar21 + (lVar29 - (int)uVar5)] >> 1) + raw[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar11 != uVar21);
              }
              break;
            case 6:
              if (0 < (int)uVar11) {
                uVar21 = 0;
                do {
                  psVar35[uVar21] = psVar8[uVar21 + (lVar29 - (int)uVar5)] + raw[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar11 != uVar21);
              }
            }
            raw = raw + (int)uVar11;
LAB_0011ba4f:
            if (lVar27 + 1U == uVar9) {
              if (7 < depth) goto LAB_0011be96;
              if (y != 0) {
                uVar17 = x - 1;
                lVar14 = uVar3 - uVar18;
                lVar13 = (ulong)uVar17 + 1;
                uVar5 = 0;
                uVar21 = 0;
                do {
                  bVar26 = 1;
                  if (color == 0) {
                    bVar26 = ""[depth];
                  }
                  psVar8 = a->out;
                  pbVar33 = psVar8 + uVar4 * (int)uVar21;
                  pbVar36 = pbVar33 + (uVar3 - uVar18);
                  uVar30 = (ulong)uVar5;
                  if (depth == 4) {
                    uVar11 = uVar6;
                    if (1 < (int)uVar6) {
                      psVar35 = psVar8 + lVar14;
                      uVar34 = uVar6;
                      do {
                        psVar8[uVar30] = (psVar35[uVar30] >> 4) * bVar26;
                        psVar8[uVar30 + 1] = (psVar35[uVar30] & 0xf) * bVar26;
                        uVar11 = uVar34 - 2;
                        psVar35 = psVar35 + 1;
                        psVar8 = psVar8 + 2;
                        bVar37 = 3 < uVar34;
                        uVar34 = uVar11;
                      } while (bVar37);
                      pbVar36 = psVar35 + uVar30;
                      pbVar33 = psVar8 + uVar30;
                    }
                    if (uVar11 == 1) {
                      *pbVar33 = (*pbVar36 >> 4) * bVar26;
                    }
                  }
                  else if (depth == 2) {
                    uVar11 = uVar6;
                    if (3 < (int)uVar6) {
                      psVar35 = psVar8 + lVar14;
                      uVar34 = uVar6;
                      do {
                        psVar8[uVar30] = (psVar35[uVar30] >> 6) * bVar26;
                        psVar8[uVar30 + 1] = (psVar35[uVar30] >> 4 & 3) * bVar26;
                        psVar8[uVar30 + 2] = (psVar35[uVar30] >> 2 & 3) * bVar26;
                        psVar8[uVar30 + 3] = (psVar35[uVar30] & 3) * bVar26;
                        uVar11 = uVar34 - 4;
                        psVar35 = psVar35 + 1;
                        psVar8 = psVar8 + 4;
                        bVar37 = 7 < uVar34;
                        uVar34 = uVar11;
                      } while (bVar37);
                      pbVar36 = psVar35 + uVar30;
                      pbVar33 = psVar8 + uVar30;
                    }
                    if (((0 < (int)uVar11) && (*pbVar33 = (*pbVar36 >> 6) * bVar26, uVar11 != 1)) &&
                       (pbVar33[1] = (*pbVar36 >> 4 & 3) * bVar26, uVar11 == 3)) {
                      pbVar33[2] = (*pbVar36 >> 2 & 3) * bVar26;
                    }
                  }
                  else if (depth == 1) {
                    uVar11 = uVar6;
                    if (7 < (int)uVar6) {
                      psVar35 = psVar8 + lVar14;
                      uVar34 = uVar6;
                      do {
                        psVar8[uVar30] = (char)psVar35[uVar30] >> 7 & bVar26;
                        psVar8[uVar30 + 1] = (char)(psVar35[uVar30] * '\x02') >> 7 & bVar26;
                        psVar8[uVar30 + 2] = (char)(psVar35[uVar30] << 2) >> 7 & bVar26;
                        psVar8[uVar30 + 3] = (char)(psVar35[uVar30] << 3) >> 7 & bVar26;
                        psVar8[uVar30 + 4] = (char)(psVar35[uVar30] << 4) >> 7 & bVar26;
                        psVar8[uVar30 + 5] = (char)(psVar35[uVar30] << 5) >> 7 & bVar26;
                        psVar8[uVar30 + 6] = (char)(psVar35[uVar30] << 6) >> 7 & bVar26;
                        bVar10 = bVar26;
                        if ((psVar35[uVar30] & 1) == 0) {
                          bVar10 = 0;
                        }
                        psVar8[uVar30 + 7] = bVar10;
                        uVar11 = uVar34 - 8;
                        psVar35 = psVar35 + 1;
                        psVar8 = psVar8 + 8;
                        bVar37 = 0xf < uVar34;
                        uVar34 = uVar11;
                      } while (bVar37);
                      pbVar36 = psVar35 + uVar30;
                      pbVar33 = psVar8 + uVar30;
                    }
                    if (((((0 < (int)uVar11) &&
                          (*pbVar33 = (char)*pbVar36 >> 7 & bVar26, uVar11 != 1)) &&
                         ((pbVar33[1] = (char)(*pbVar36 * '\x02') >> 7 & bVar26, 2 < uVar11 &&
                          ((pbVar33[2] = (char)(*pbVar36 << 2) >> 7 & bVar26, uVar11 != 3 &&
                           (pbVar33[3] = (char)(*pbVar36 << 3) >> 7 & bVar26, 4 < uVar11)))))) &&
                        (pbVar33[4] = (char)(*pbVar36 << 4) >> 7 & bVar26, uVar11 != 5)) &&
                       (pbVar33[5] = (char)(*pbVar36 << 5) >> 7 & bVar26, uVar11 == 7)) {
                      pbVar33[6] = (char)(*pbVar36 << 6) >> 7 & bVar26;
                    }
                  }
                  if (iVar2 != out_n) {
                    psVar8 = a->out;
                    if (iVar2 == 1) {
                      lVar15 = lVar13;
                      if (-1 < (int)uVar17) {
                        do {
                          psVar8[lVar15 * 2 + (uVar30 - 1)] = 0xff;
                          psVar8[lVar15 * 2 + (uVar30 - 2)] = psVar8[lVar15 + (uVar30 - 1)];
                          lVar25 = lVar15 + -1;
                          bVar37 = 0 < lVar15;
                          lVar15 = lVar25;
                        } while (lVar25 != 0 && bVar37);
                      }
                    }
                    else {
                      if (iVar2 != 3) {
                        __assert_fail("img_n == 3",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                                      ,0x1171,
                                      "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                     );
                      }
                      if (-1 < (int)uVar17) {
                        psVar35 = psVar8 + (ulong)uVar17 * 3 + 2 + uVar30;
                        lVar15 = lVar13;
                        do {
                          psVar8[lVar15 * 4 + (uVar30 - 1)] = 0xff;
                          psVar8[lVar15 * 4 + (uVar30 - 2)] = *psVar35;
                          psVar8[lVar15 * 4 + (uVar30 - 3)] = psVar35[-1];
                          psVar8[lVar15 * 4 + (uVar30 - 4)] = psVar35[-2];
                          psVar35 = psVar35 + -3;
                          lVar25 = lVar15 + -1;
                          bVar37 = 0 < lVar15;
                          lVar15 = lVar25;
                        } while (lVar25 != 0 && bVar37);
                      }
                    }
                  }
                  uVar21 = uVar21 + 1;
                  uVar5 = uVar5 + uVar4;
                } while (uVar21 != uVar9);
                return 1;
              }
              goto LAB_0011bed6;
            }
          }
          else {
            if (iVar2 + 1 != out_n) {
              __assert_fail("img_n+1 == out_n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                            ,0x1118,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            switch(bVar26) {
            case 0:
              if (iVar7 != 0) {
                iVar22 = iVar7;
                do {
                  if (0 < (int)uVar5) {
                    uVar30 = 0;
                    do {
                      psVar35[uVar30] = raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar5 != uVar30);
                  }
                  psVar35[(int)uVar5] = 0xff;
                  raw = raw + (int)uVar5;
                  psVar35 = psVar35 + lVar14;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              break;
            case 1:
              if (iVar7 != 0) {
                psVar8 = psVar8 + lVar29 + lVar15;
                iVar22 = iVar7;
                do {
                  if (0 < (int)uVar5) {
                    uVar30 = 0;
                    do {
                      psVar35[uVar30] = psVar8[uVar30] + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar5 != uVar30);
                  }
                  psVar35[(int)uVar5] = 0xff;
                  raw = raw + (int)uVar5;
                  psVar35 = psVar35 + lVar14;
                  psVar8 = psVar8 + lVar14;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              break;
            case 2:
              if (iVar7 != 0) {
                iVar22 = iVar7;
                do {
                  if (0 < (int)uVar5) {
                    uVar30 = 0;
                    do {
                      psVar35[uVar30] = psVar35[uVar30 + lVar25] + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar5 != uVar30);
                  }
                  psVar35[(int)uVar5] = 0xff;
                  raw = raw + (int)uVar5;
                  psVar35 = psVar35 + lVar14;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              break;
            case 3:
              if (iVar7 != 0) {
                iVar22 = iVar7;
                do {
                  if (0 < (int)uVar5) {
                    uVar30 = 0;
                    psVar8 = psVar35;
                    do {
                      *psVar8 = (char)((uint)psVar8[lVar15] + (uint)psVar8[lVar25] >> 1) +
                                raw[uVar30];
                      uVar30 = uVar30 + 1;
                      psVar8 = psVar8 + 1;
                    } while (uVar5 != uVar30);
                  }
                  psVar35[(int)uVar5] = 0xff;
                  raw = raw + (int)uVar5;
                  psVar35 = psVar35 + lVar14;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              break;
            case 4:
              if (iVar7 != 0) {
                psVar19 = psVar8 + lVar29 + lVar25;
                psVar31 = psVar8 + lVar29 + lVar15;
                psVar8 = psVar8 + lVar29 + (lVar15 - (ulong)uVar4);
                iVar22 = iVar7;
                do {
                  if (0 < (int)uVar5) {
                    uVar30 = 0;
                    do {
                      bVar26 = psVar31[uVar30];
                      bVar10 = psVar19[uVar30];
                      bVar28 = psVar8[uVar30];
                      iVar24 = ((uint)bVar10 + (uint)bVar26) - (uint)bVar28;
                      uVar34 = iVar24 - (uint)bVar26;
                      uVar11 = -uVar34;
                      if (0 < (int)uVar34) {
                        uVar11 = uVar34;
                      }
                      uVar32 = iVar24 - (uint)bVar10;
                      uVar34 = -uVar32;
                      if (0 < (int)uVar32) {
                        uVar34 = uVar32;
                      }
                      uVar20 = iVar24 - (uint)bVar28;
                      uVar32 = -uVar20;
                      if (0 < (int)uVar20) {
                        uVar32 = uVar20;
                      }
                      if (uVar34 <= uVar32) {
                        bVar28 = bVar10;
                      }
                      if (uVar32 < uVar11) {
                        bVar26 = bVar28;
                      }
                      if (uVar34 < uVar11) {
                        bVar26 = bVar28;
                      }
                      psVar35[uVar30] = bVar26 + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar5 != uVar30);
                  }
                  psVar35[(int)uVar5] = 0xff;
                  raw = raw + (int)uVar5;
                  psVar35 = psVar35 + lVar14;
                  psVar19 = psVar19 + lVar14;
                  psVar31 = psVar31 + lVar14;
                  psVar8 = psVar8 + lVar14;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              break;
            case 5:
              if (iVar7 != 0) {
                psVar8 = psVar8 + lVar29 + lVar15;
                iVar22 = iVar7;
                do {
                  if (0 < (int)uVar5) {
                    uVar30 = 0;
                    do {
                      psVar35[uVar30] = (psVar8[uVar30] >> 1) + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar5 != uVar30);
                  }
                  psVar35[(int)uVar5] = 0xff;
                  raw = raw + (int)uVar5;
                  psVar35 = psVar35 + lVar14;
                  psVar8 = psVar8 + lVar14;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
              break;
            case 6:
              if (iVar7 != 0) {
                psVar8 = psVar8 + lVar29 + lVar15;
                iVar22 = iVar7;
                do {
                  if (0 < (int)uVar5) {
                    uVar30 = 0;
                    do {
                      psVar35[uVar30] = psVar8[uVar30] + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar5 != uVar30);
                  }
                  psVar35[(int)uVar5] = 0xff;
                  raw = raw + (int)uVar5;
                  psVar35 = psVar35 + lVar14;
                  psVar8 = psVar8 + lVar14;
                  iVar22 = iVar22 + -1;
                } while (iVar22 != 0);
              }
            }
            if (depth != 0x10) goto LAB_0011ba4f;
            if (x != 0) {
              psVar8 = a->out + (long)(int)uVar5 + uVar21 + 1;
              sVar12 = x;
              do {
                *psVar8 = 0xff;
                psVar8 = psVar8 + lVar14;
                sVar12 = sVar12 - 1;
              } while (sVar12 != 0);
              goto LAB_0011ba4f;
            }
            if (lVar27 + 1U == uVar9) goto LAB_0011bea8;
          }
          lVar27 = lVar27 + 1;
          uVar21 = (ulong)(uVar4 * (int)lVar27);
          psVar8 = a->out + uVar21;
          bVar26 = *raw;
        } while (bVar26 < 5);
      }
      stbi__g_failure_reason = "invalid filter";
    }
  }
  return local_d0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }